

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>_>
* __thiscall
phmap::priv::
base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
::equal_range(pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>_>
              *__return_storage_ptr__,
             base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             *this,key_type *key)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
  tree_iter;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
  tree_iter_00;
  pair<std::_Rb_tree_const_iterator<int>,_std::_Rb_tree_const_iterator<int>_> pVar5;
  _Rb_tree_const_iterator<int> local_28;
  pair<std::_Rb_tree_const_iterator<int>,_std::_Rb_tree_const_iterator<int>_> checker_res;
  key_type *key_local;
  base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
  *this_local;
  
  pVar5 = std::multiset<int,_std::less<int>,_std::allocator<int>_>::equal_range(&this->checker_,key)
  ;
  btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
  ::equal_range<int>(__return_storage_ptr__,
                     (btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                      *)this,key);
  uVar1 = (__return_storage_ptr__->first).node;
  uVar2 = (__return_storage_ptr__->first).position;
  tree_iter.position = uVar2;
  tree_iter.node =
       (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
        *)uVar1;
  local_28 = pVar5.first._M_node;
  tree_iter._12_4_ = 0;
  base_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
  ::
  iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>,int&,int*>,std::_Rb_tree_const_iterator<int>>
            ((base_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
              *)this,tree_iter,local_28);
  uVar3 = (__return_storage_ptr__->second).node;
  uVar4 = (__return_storage_ptr__->second).position;
  tree_iter_00.position = uVar4;
  tree_iter_00.node =
       (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
        *)uVar3;
  checker_res.first = pVar5.second._M_node;
  tree_iter_00._12_4_ = 0;
  base_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
  ::
  iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>,int&,int*>,std::_Rb_tree_const_iterator<int>>
            ((base_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
              *)this,tree_iter_00,checker_res.first);
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, iterator> equal_range(const key_type &key) {
        std::pair<typename CheckerType::iterator, typename CheckerType::iterator>
            checker_res = checker_.equal_range(key);
        std::pair<iterator, iterator> tree_res = tree_.equal_range(key);
        iter_check(tree_res.first, checker_res.first);
        iter_check(tree_res.second, checker_res.second);
        return tree_res;
    }